

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O2

SPxId __thiscall
soplex::SPxBoundFlippingRT<double>::selectEnter
          (SPxBoundFlippingRT<double> *this,double *val,int leaveIdx,bool polish)

{
  double dVar1;
  SPxSolverBase<double> *pSVar2;
  UpdateVector<double> *pUVar3;
  double *vec;
  double *low;
  double *upp;
  pointer pBVar4;
  pointer pBVar5;
  double dVar6;
  BreakpointSource BVar7;
  int iVar8;
  SPxId SVar9;
  pointer pdVar10;
  DataKey DVar11;
  double *pdVar12;
  undefined8 uVar13;
  pointer pdVar15;
  int iVar16;
  ulong uVar17;
  UpdateVector<double> *pUVar18;
  Breakpoint *pBVar19;
  double *upd;
  double *vec_00;
  double *pdVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  bool bVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  int *piVar29;
  double dVar30;
  undefined8 uVar31;
  double *low_00;
  double *low_01;
  double *upp_00;
  double *upp_01;
  int nBp;
  double local_118;
  int minIdx;
  undefined8 local_108;
  undefined8 uStack_100;
  uint local_f8;
  int local_f4;
  double local_f0;
  uint local_e4;
  double *local_e0;
  SPxId enterId;
  BreakpointCompare local_70;
  double local_68;
  undefined8 uStack_60;
  Breakpoint tmp;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  undefined8 uVar14;
  
  pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
  if (pSVar2->leaveCount % 100 == 0) {
    this->flipPotential = 1.0;
  }
  if ((((this->super_SPxFastRT<double>).field_0x51 != '\x01' || polish) || (pSVar2->theRep == ROW))
     || (this->flipPotential <= 0.0)) {
    SVar9 = SPxFastRT<double>::selectEnter(&this->super_SPxFastRT<double>,val,leaveIdx,polish);
    return (SPxId)SVar9.super_DataKey;
  }
  pUVar18 = pSVar2->theCoPvec;
  pUVar3 = pSVar2->thePvec;
  pdVar20 = (pUVar3->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  upd = (pUVar3->thedelta).super_VectorBase<double>.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ;
  piVar29 = (pUVar3->thedelta).super_IdxSet.idx;
  iVar8 = (pUVar3->thedelta).super_IdxSet.num;
  low_01 = (pSVar2->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  upp_01 = (pSVar2->theUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  vec = (pUVar18->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start;
  local_e0 = (pUVar18->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_108 = (pUVar18->thedelta).super_IdxSet.idx;
  local_118 = (double)CONCAT44(local_118._4_4_,(pUVar18->thedelta).super_IdxSet.num);
  low = (pSVar2->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  upp = (pSVar2->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  local_f0 = *val;
  *val = 0.0;
  nBp = 0;
  minIdx = -1;
  if (local_f0 <= 0.0) {
    collectBreakpointsMin(this,&nBp,&minIdx,piVar29,iVar8,upd,pdVar20,upp_01,low_01,PVEC);
    collectBreakpointsMin(this,&nBp,&minIdx,local_108,local_118._0_4_,local_e0,vec,upp,low,COPVEC);
  }
  else {
    collectBreakpointsMax(this,&nBp,&minIdx,piVar29,iVar8,upd,pdVar20,upp_01,low_01,PVEC);
    collectBreakpointsMax(this,&nBp,&minIdx,local_108,local_118._0_4_,local_e0,vec,upp,low,COPVEC);
  }
  if (nBp == 0) {
    *val = local_f0;
    uVar13._0_4_ = enterId.super_DataKey.info;
    uVar13._4_4_ = enterId.super_DataKey.idx;
    return (SPxId)uVar13;
  }
  pBVar4 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar5 = pBVar4 + minIdx;
  tmp.val = pBVar5->val;
  tmp.idx = pBVar5->idx;
  tmp.src = pBVar5->src;
  iVar8 = pBVar4->idx;
  BVar7 = pBVar4->src;
  pBVar5 = pBVar4 + minIdx;
  pBVar5->val = pBVar4->val;
  pBVar5->idx = iVar8;
  pBVar5->src = BVar7;
  pBVar5 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar5->val = tmp.val;
  pBVar5->idx = tmp.idx;
  pBVar5->src = tmp.src;
  pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
  dVar30 = (pSVar2->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[leaveIdx];
  uVar27 = 0;
  uVar28 = 0;
  if ((dVar30 == 0.0) && (!NAN(dVar30))) {
    dVar30 = pSVar2->instableLeaveVal;
  }
  piVar29 = (int *)((ulong)dVar30 & 0x7fffffffffffffff);
  local_70.entry =
       (this->breakpoints).data.
       super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
       ._M_impl.super__Vector_impl_data._M_start;
  lVar25 = 0;
  uVar17 = 0;
  iVar8 = 0;
  uVar31 = 0;
  local_f4 = leaveIdx;
  while( true ) {
    iVar16 = (int)uVar17;
    local_118 = (double)CONCAT44(uVar28,uVar27);
    if ((nBp <= iVar16) || ((double)piVar29 <= 0.0)) break;
    pBVar19 = (this->breakpoints).data.
              super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_108 = piVar29;
    uStack_100 = uVar31;
    if (iVar8 < iVar16) {
      iVar8 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                        (pBVar19,&local_70,iVar8 + 1,nBp,4,0,0,true);
      pBVar19 = (this->breakpoints).data.
                super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    iVar16 = *(int *)((long)&pBVar19->idx + lVar25);
    pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
    if (*(int *)((long)&pBVar19->src + lVar25) == 0) {
      if (pSVar2->theRep * ((pSVar2->super_SPxBasisBase<double>).thedesc.stat)->data[iVar16] < 1) {
        uVar27 = SUB84(ABS(upd[iVar16]),0);
        uVar28 = (undefined4)((ulong)ABS(upd[iVar16]) >> 0x20);
        pdVar15 = (pSVar2->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar10 = (pSVar2->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        goto LAB_001d586c;
      }
      *(undefined4 *)((long)&pBVar19->idx + lVar25) = 0xffffffff;
      pUVar18 = pSVar2->thePvec;
LAB_001d5816:
      SSVectorBase<double>::clearIdx(&pUVar18->thedelta,iVar16);
      uVar27 = SUB84(local_118,0);
      uVar28 = (undefined4)((ulong)local_118 >> 0x20);
      piVar29 = local_108;
    }
    else {
      if (0 < pSVar2->theRep * ((pSVar2->super_SPxBasisBase<double>).thedesc.costat)->data[iVar16])
      {
        *(undefined4 *)((long)&pBVar19->idx + lVar25) = 0xffffffff;
        pUVar18 = pSVar2->theCoPvec;
        goto LAB_001d5816;
      }
      uVar27 = SUB84(ABS(local_e0[iVar16]),0);
      uVar28 = (undefined4)((ulong)ABS(local_e0[iVar16]) >> 0x20);
      pdVar15 = (pSVar2->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar10 = (pSVar2->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
LAB_001d586c:
      piVar29 = (int *)((double)local_108 -
                       (pdVar10[iVar16] * (double)CONCAT44(uVar28,uVar27) -
                       pdVar15[iVar16] * (double)CONCAT44(uVar28,uVar27)));
      if ((double)CONCAT44(uVar28,uVar27) <= local_118) {
        uVar27 = SUB84(local_118,0);
        uVar28 = (undefined4)((ulong)local_118 >> 0x20);
      }
    }
    uVar17 = uVar17 + 1;
    lVar25 = lVar25 + 0x10;
    uVar31 = uStack_100;
  }
  lVar22 = uVar17 - 1;
  uVar21 = (uint)lVar22;
  local_e4 = uVar21;
  if ((nBp <= iVar16) &&
     (pdVar12 = &(this->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta,
     *pdVar12 <= (double)piVar29 && (double)piVar29 != *pdVar12)) {
    this->flipPotential = this->flipPotential + -0.5;
    *val = local_f0;
    DVar11 = (DataKey)SPxFastRT<double>::selectEnter
                                (&this->super_SPxFastRT<double>,val,local_f4,false);
    uVar14._0_4_ = DVar11.info;
    uVar14._4_4_ = DVar11.idx;
    return (SPxId)uVar14;
  }
  local_108 = *(int **)((long)&(this->breakpoints).data.
                               super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].val + lVar25);
  local_f8 = 0xffffffff;
LAB_001d591d:
  lVar23 = lVar22 * 0x10 + 0x18;
  lVar25 = lVar22;
  do {
    lVar22 = lVar25 + 1;
    if (nBp <= lVar22) goto LAB_001d5b2e;
    pBVar19 = (this->breakpoints).data.
              super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (iVar8 <= lVar25) {
      iVar8 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                        (pBVar19,&local_70,iVar8 + 1,nBp,4,0,0,true);
      pBVar19 = (this->breakpoints).data.
                super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    iVar16 = *(int *)((long)&pBVar19->val + lVar23);
    pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
    if (*(int *)((long)&pBVar19->val + lVar23 + 4) == 0) {
      lVar25 = 0x6c0;
      if (pSVar2->theRep * ((pSVar2->super_SPxBasisBase<double>).thedesc.stat)->data[iVar16] < 1) {
        dVar30 = upd[iVar16];
        dVar6 = 0.0;
        if (ABS(dVar30) <= local_118) goto LAB_001d5b19;
        uStack_60 = 0;
        local_68 = ABS(dVar30);
        dVar6 = SVectorBase<double>::operator*
                          ((SVectorBase<double> *)
                           ((pSVar2->thevectors->set).theitem +
                           (pSVar2->thevectors->set).thekey[iVar16].idx),
                           &pSVar2->theCoPvec->super_VectorBase<double>);
        pdVar12 = low_01;
        if (0.0 < dVar30) {
          pdVar12 = upp_01;
        }
        (((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->thePvec->
        super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar16] = dVar6;
        dVar6 = (pdVar12[iVar16] - pdVar20[iVar16]) / dVar30;
        dVar30 = local_68;
        if ((double)local_108 < dVar6) goto LAB_001d5b19;
        goto LAB_001d5b13;
      }
    }
    else {
      lVar25 = 0x6b8;
      if (pSVar2->theRep * ((pSVar2->super_SPxBasisBase<double>).thedesc.costat)->data[iVar16] < 1)
      break;
    }
    *(undefined4 *)((long)&pBVar19->val + lVar23) = 0xffffffff;
    SSVectorBase<double>::clearIdx
              ((SSVectorBase<double> *)
               (*(long *)((long)&(pSVar2->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                 super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                                 _vptr_ClassArray + lVar25) + 0x20),iVar16);
    lVar23 = lVar23 + 0x10;
    lVar25 = lVar22;
  } while( true );
  dVar1 = local_e0[iVar16];
  dVar30 = ABS(dVar1);
  dVar6 = 0.0;
  if (local_118 < dVar30) {
    pdVar12 = low;
    if (0.0 < dVar1) {
      pdVar12 = upp;
    }
    dVar6 = (pdVar12[iVar16] - vec[iVar16]) / dVar1;
    if (dVar6 <= (double)local_108) {
LAB_001d5b13:
      local_118 = dVar30;
      local_f8 = (uint)lVar22;
    }
  }
LAB_001d5b19:
  if ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta + (double)local_108 < dVar6
     ) goto LAB_001d5b2e;
  goto LAB_001d591d;
LAB_001d5b2e:
  dVar30 = (this->super_SPxFastRT<double>).fastDelta;
  bVar26 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->instableLeave;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(this->super_SPxFastRT<double>).super_SPxRatioTester<double>._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  local_108 = (int *)(local_40._M_ptr)->s_epsilon_multiplier;
  uStack_100 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  iVar8 = local_f4;
  if (bVar26 == false) {
    dVar6 = (this->super_SPxFastRT<double>).minStab;
    local_108 = (int *)(-(ulong)(local_118 < 1000.0) & (ulong)dVar6 |
                       ~-(ulong)(local_118 < 1000.0) & (ulong)((local_118 * dVar6) / 1000.0));
  }
  else {
    local_108 = (int *)(~-(ulong)((double)local_108 == 1.0) & (ulong)((double)local_108 * 1e-10) |
                       -(ulong)((double)local_108 == 1.0) & 0x3ddb7cdfd9d7bdbb);
  }
  uStack_100 = 0;
  dVar30 = dVar30 / local_118;
  if ((int)local_f8 < 0) {
    bVar26 = false;
    uVar27 = (undefined4)local_108;
    uVar28 = local_108._4_4_;
    while ((uVar21 = (uint)uVar17, bVar26 == false && (uVar24 = uVar21 - 1, -1 < (int)uVar24))) {
      pBVar5 = (this->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar8 = pBVar5[uVar24].idx;
      if (iVar8 < 0) {
        bVar26 = false;
      }
      else {
        bVar26 = pBVar5[uVar24].src != PVEC;
        pdVar12 = upd;
        vec_00 = pdVar20;
        low_00 = low_01;
        upp_00 = upp_01;
        if (bVar26) {
          pdVar12 = local_e0;
          vec_00 = vec;
          low_00 = low;
          upp_00 = upp;
        }
        bVar26 = getData(this,val,&enterId,iVar8,(double)CONCAT44(uVar28,uVar27),dVar30,pdVar12,
                         vec_00,low_00,upp_00,(uint)bVar26,local_f0);
        uVar27 = (undefined4)local_108;
        uVar28 = local_108._4_4_;
      }
      local_e4 = uVar21 - 2;
      uVar17 = (ulong)uVar24;
    }
    iVar8 = local_f4;
    local_e4 = uVar21;
    if (bVar26 != false) {
LAB_001d5dac:
      this->relax_count = 0;
      SPxFastRT<double>::tighten(&this->super_SPxFastRT<double>);
      if (((int)uVar21 < 1) ||
         (dVar30 = ABS((this->breakpoints).data.
                       super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar21].val),
         pdVar20 = &(this->super_SPxFastRT<double>).fastDelta,
         dVar30 < *pdVar20 || dVar30 == *pdVar20)) {
        ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips = 0;
        dVar30 = this->flipPotential + -0.1;
      }
      else {
        flipAndUpdate(this,(int *)&local_e4);
        ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips =
             local_e4;
        if ((int)local_e4 < 10) {
          dVar30 = this->flipPotential + -0.05;
        }
        else {
          dVar30 = 1.0;
        }
      }
      this->flipPotential = dVar30;
      uVar31._0_4_ = enterId.super_DataKey.info;
      uVar31._4_4_ = enterId.super_DataKey.idx;
      return (SPxId)uVar31;
    }
  }
  else if ((double)local_108 < local_118) {
    pBVar5 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar26 = pBVar5[local_f8].src != PVEC;
    if (bVar26) {
      upd = local_e0;
      pdVar20 = vec;
      low_01 = low;
      upp_01 = upp;
    }
    bVar26 = getData(this,val,&enterId,pBVar5[local_f8].idx,(double)local_108,dVar30,upd,pdVar20,
                     low_01,upp_01,(uint)bVar26,local_f0);
    if (bVar26) goto LAB_001d5dac;
  }
  if (this->relax_count < 2) {
    SPxFastRT<double>::relax(&this->super_SPxFastRT<double>);
    this->relax_count = this->relax_count + 1;
    *val = local_f0;
    enterId = selectEnter(this,val,iVar8,false);
  }
  return (SPxId)enterId.super_DataKey;
}

Assistant:

SPxId SPxBoundFlippingRT<R>::selectEnter(
   R&                 val,
   int                   leaveIdx,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::LEAVE);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->leaveCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DLBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(!enableBoundFlips || polish || this->thesolver->rep() == SPxSolverBase<R>::ROW
         || flipPotential <= 0)
   {
      SPxOut::debug(this, "DLBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectEnter(val, leaveIdx, polish);
   }

   const R*  pvec = this->thesolver->pVec().get_const_ptr();
   const R*  pupd = this->thesolver->pVec().delta().values();
   const int*   pidx = this->thesolver->pVec().delta().indexMem();
   int          pupdnnz = this->thesolver->pVec().delta().size();
   const R*  lpb  = this->thesolver->lpBound().get_const_ptr();
   const R*  upb  = this->thesolver->upBound().get_const_ptr();

   const R*  cvec = this->thesolver->coPvec().get_const_ptr();
   const R*  cupd = this->thesolver->coPvec().delta().values();
   const int*   cidx = this->thesolver->coPvec().delta().indexMem();
   int          cupdnnz = this->thesolver->coPvec().delta().size();
   const R*  lcb  = this->thesolver->lcBound().get_const_ptr();
   const R*  ucb  = this->thesolver->ucBound().get_const_ptr();

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid enterId
   SPxId enterId;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMax(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMin(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }

   if(nBp == 0)
   {
      val = max;
      return enterId;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(this->thesolver->fTest()[leaveIdx]);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableLeaveNum >= 0);
      // restore original slope
      slope = spxAbs(this->thesolver->instableLeaveVal);
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int i = breakpoints[npassedBp].idx;

      // compute new slope
      if(breakpoints[npassedBp].src == PVEC)
      {
         if(this->thesolver->isBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(pupd[i]);
            slope -= (this->thesolver->upper(i) * absupd) - (this->thesolver->lower(i) * absupd);

            // get most stable pivot
            if(absupd > moststable)
               moststable = absupd;
         }
      }
      else
      {
         assert(breakpoints[npassedBp].src == COPVEC);

         if(this->thesolver->isCoBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(cupd[i]);
            slope -= (this->thesolver->rhs(i) * absupd) - (this->thesolver->lhs(i) * absupd);

            if(absupd > moststable)
               moststable = absupd;
         }
      }
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DLBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectEnter(val, leaveIdx);
   }

   SPxOut::debug(this, "DLBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int idx = breakpoints[stableBp].idx;

      if(breakpoints[stableBp].src == PVEC)
      {
         if(this->thesolver->isBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(idx);
            continue;
         }

         R x = pupd[idx];

         if(spxAbs(x) > moststable)
         {
            this->thesolver->pVec()[idx] = this->thesolver->vector(idx) * this->thesolver->coPvec();
            stableDelta = (x > 0.0) ? upb[idx] : lpb[idx];
            stableDelta = (stableDelta - pvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }
      else
      {
         if(this->thesolver->isCoBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(idx);
            continue;
         }

         R x = cupd[idx];

         if(spxAbs(x) > moststable)
         {
            stableDelta = (x > 0.0) ? ucb[idx] : lcb[idx];
            stableDelta = (stableDelta - cvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }

      // stop searching if the step length is too big
      if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableLeave;
   assert(!instable || this->thesolver->instableLeaveNum >= 0);
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int idx = breakpoints[bestBp].idx;
         assert(idx >= 0);

         if(breakpoints[bestBp].src == PVEC)
            foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
         else
            foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int idx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(idx >= 0)
         {
            if(breakpoints[npassedBp].src == PVEC)
               foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
            else
               foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(!enterId.isValid());

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DLBFRT04 {}: no valid enterId found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectEnter(val, leaveIdx);
      }
      else
      {
         SPxOut::debug(this, "DLBFRT05 {}: no valid enterId found - breaking...\n",
                       this->thesolver->basis().iteration());
         return enterId;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DLBFRT06 {}: selected Id: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), enterId, nBp);
   return enterId;
}